

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.hpp
# Opt level: O0

type jsoncons::binary::
     native_to_little<long,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::detail::endian>
               (long val,
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               d_first)

{
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> this;
  uint8_t item;
  uint8_t *__end0;
  uint8_t *__begin0;
  uint8_t (*__range2) [8];
  uint8_t buf [8];
  value_type_conflict *in_stack_ffffffffffffffb8;
  undefined1 *local_28;
  undefined1 local_18 [8];
  undefined1 local_10 [8];
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_8;
  
  for (local_28 = local_18; local_28 != local_10; local_28 = local_28 + 1) {
    this = std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
           operator++(&local_8,0);
    std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
    operator*((back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
              &stack0xffffffffffffffc0);
    std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
    operator=((back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
              this.container,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

typename std::enable_if<Endian::native == Endian::little,void>::type
    native_to_little(T val, OutputIt d_first)
    {
        uint8_t buf[sizeof(T)];
        std::memcpy(buf, &val, sizeof(T));
        for (auto item : buf)
        {
            *d_first++ = item;
        }
    }